

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_predictor_8x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  long lVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  
  uVar1 = *(ulong *)above;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3._12_2_ = (short)(uVar1 >> 0x30);
  auVar6._8_2_ = (short)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._10_4_ = auVar3._10_4_;
  auVar12._6_8_ = 0;
  auVar12._0_6_ = auVar6._8_6_;
  auVar9._4_2_ = (short)(uVar1 >> 0x10);
  auVar9._0_4_ = (uint)uVar1;
  auVar9._6_8_ = SUB148(auVar12 << 0x40,6);
  uVar2 = *(ulong *)(above + 4);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4._12_2_ = (short)(uVar2 >> 0x30);
  auVar7._8_2_ = (short)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._10_4_ = auVar4._10_4_;
  auVar13._6_8_ = 0;
  auVar13._0_6_ = auVar7._8_6_;
  auVar10._4_2_ = (short)(uVar2 >> 0x10);
  auVar10._0_4_ = (uint)uVar2;
  auVar10._6_8_ = SUB148(auVar13 << 0x40,6);
  iVar21 = (auVar4._10_4_ >> 0x10) + (auVar3._10_4_ >> 0x10) + auVar10._4_4_ + auVar9._4_4_ +
           auVar7._8_4_ + auVar6._8_4_ + ((uint)uVar2 & 0xffff) + ((uint)uVar1 & 0xffff);
  iVar18 = 0;
  iVar19 = 0;
  iVar20 = 0;
  lVar15 = 0;
  do {
    uVar1 = *(ulong *)(left + lVar15);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5._12_2_ = (short)(uVar1 >> 0x30);
    auVar8._8_2_ = (short)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar8._10_4_ = auVar5._10_4_;
    auVar14._6_8_ = 0;
    auVar14._0_6_ = auVar8._8_6_;
    auVar11._4_2_ = (short)(uVar1 >> 0x10);
    auVar11._0_4_ = (uint)uVar1;
    auVar11._6_8_ = SUB148(auVar14 << 0x40,6);
    iVar21 = iVar21 + ((uint)uVar1 & 0xffff);
    iVar18 = iVar18 + auVar11._4_4_;
    iVar19 = iVar19 + auVar8._8_4_;
    iVar20 = iVar20 + (auVar5._10_4_ >> 0x10);
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x10);
  auVar17 = ZEXT416((iVar20 + iVar18 + iVar19 + iVar21 + 0xcU >> 3) * 0xaaab >> 0x11);
  auVar17 = pshuflw(auVar17,auVar17,0);
  uVar16 = auVar17._0_4_;
  iVar21 = 0x10;
  do {
    *(undefined4 *)dst = uVar16;
    *(undefined4 *)(dst + 2) = uVar16;
    *(undefined4 *)(dst + 4) = uVar16;
    *(undefined4 *)(dst + 6) = uVar16;
    dst = dst + stride;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  return;
}

Assistant:

static inline void highbd_dc_predictor_rect(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd,
                                            int shift1, uint32_t multiplier) {
  int sum = 0;
  (void)bd;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, HIGHBD_DC_SHIFT2);
  assert(expected_dc < (1 << bd));

  for (int r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}